

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum_Base.h
# Opt level: O0

uint32_t Hacl_Bignum_Lib_bn_get_bits_u32(uint32_t len,uint32_t *b,uint32_t i,uint32_t l)

{
  uint uVar1;
  sbyte sVar2;
  uint local_30;
  uint32_t ite;
  uint32_t p1;
  uint32_t j;
  uint32_t i1;
  uint32_t l_local;
  uint32_t i_local;
  uint32_t *b_local;
  uint32_t len_local;
  
  uVar1 = i >> 5;
  sVar2 = (sbyte)(i & 0x1f);
  local_30 = b[uVar1] >> sVar2;
  if ((uVar1 + 1 < len) && ((i & 0x1f) != 0)) {
    local_30 = local_30 | b[uVar1 + 1] << (0x20U - sVar2 & 0x1f);
  }
  return local_30 & (1 << ((byte)l & 0x1f)) - 1U;
}

Assistant:

static inline uint32_t
Hacl_Bignum_Lib_bn_get_bits_u32(uint32_t len, uint32_t *b, uint32_t i, uint32_t l)
{
  uint32_t i1 = i / 32U;
  uint32_t j = i % 32U;
  uint32_t p1 = b[i1] >> j;
  uint32_t ite;
  if (i1 + 1U < len && 0U < j)
  {
    ite = p1 | b[i1 + 1U] << (32U - j);
  }
  else
  {
    ite = p1;
  }
  return ite & ((1U << l) - 1U);
}